

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printT2AddrModeImm8s4Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  MCOperand *op;
  MCOperand *op_00;
  char *pcVar7;
  ulong uVar8;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  _Var4 = MCOperand_isReg(op);
  if (!_Var4) {
    printOperand(MI,OpNum,O);
    return;
  }
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar5 = MCOperand_getReg(op);
  pcVar7 = (*pcVar2->get_regname)(uVar5);
  SStream_concat0(O,pcVar7);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar5 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
  }
  uVar8 = MCOperand_getImm(op_00);
  uVar6 = (uint)uVar8;
  uVar5 = -uVar6;
  if ((int)uVar6 < 0) {
    uVar8 = (ulong)-uVar6;
    pcVar7 = ", #-0x%x";
  }
  else {
    uVar5 = CONCAT31((int3)(uVar5 >> 8),uVar6 == 0);
    if (uVar6 == 0 && !AlwaysPrintImm0) goto LAB_00162f43;
    if (uVar6 < 10) {
      pcVar7 = ", #%u";
    }
    else {
      pcVar7 = ", #0x%x";
    }
    uVar8 = uVar8 & 0xffffffff;
  }
  SStream_concat(O,pcVar7,uVar8,(ulong)uVar5);
LAB_00162f43:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x52) = uVar6;
  }
  SStream_concat0(O,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printT2AddrModeImm8s4Operand(MCInst *MI,
		unsigned OpNum, SStream *O, bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	if (!MCOperand_isReg(MO1)) {   //  For label symbolic references.
		printOperand(MI, OpNum, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;

	//assert(((OffImm & 0x3) == 0) && "Not a valid immediate!");

	// Don't print +0.
	if (OffImm == INT32_MIN)
		OffImm = 0;
	if (isSub) {
		SStream_concat(O, ", #-0x%x", -OffImm);
	} else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm > HEX_THRESHOLD)
			SStream_concat(O, ", #0x%x", OffImm);
		else
			SStream_concat(O, ", #%u", OffImm);
	}
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;

	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}